

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatconfig.c
# Opt level: O0

int ec_findconfig(uint32 man,uint32 id)

{
  bool bVar1;
  int local_14;
  int i;
  uint32 id_local;
  uint32 man_local;
  
  local_14 = 0;
  do {
    local_14 = local_14 + 1;
    bVar1 = false;
    if ((ec_configlist[local_14].man != 0xffffffff) &&
       (bVar1 = true, ec_configlist[local_14].man == man)) {
      bVar1 = ec_configlist[local_14].id != id;
    }
  } while (bVar1);
  if (ec_configlist[local_14].man == 0xffffffff) {
    local_14 = 0;
  }
  return local_14;
}

Assistant:

int ec_findconfig( uint32 man, uint32 id)
{
   int i = 0;

   do 
   {
      i++;
   } while ( (ec_configlist[i].man != EC_CONFIGEND) && 
           ((ec_configlist[i].man != man) || (ec_configlist[i].id != id)) );
   if (ec_configlist[i].man == EC_CONFIGEND)
   {
      i = 0;
   }
   return i;
}